

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin1.c
# Opt level: O1

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority(Aig_Man_t *pAig,Abc_Cex_t *pCex,Vec_Vec_t *vFrameCis)

{
  int iVar1;
  Vec_Int_t *p;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  Vec_Vec_t *vFramePPs;
  void **ppvVar5;
  undefined8 *puVar6;
  Vec_Int_t *vRoots;
  int *piVar7;
  uint uVar8;
  int iVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  
  pVVar10 = pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar4 = 0;
    do {
      if (pVVar10->pArray[lVar4] != (void *)0x0) {
        *(undefined4 *)((long)pVVar10->pArray[lVar4] + 0x28) = 0xffffffff;
      }
      lVar4 = lVar4 + 1;
      pVVar10 = pAig->vObjs;
    } while (lVar4 < pVVar10->nSize);
  }
  uVar12 = pCex->iFrame;
  uVar13 = uVar12 + 1;
  vFramePPs = (Vec_Vec_t *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar12) {
    uVar8 = uVar13;
  }
  vFramePPs->nSize = 0;
  vFramePPs->nCap = uVar8;
  if (uVar8 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)(int)uVar8 << 3);
  }
  vFramePPs->pArray = ppvVar5;
  if (-1 < (int)uVar12) {
    uVar11 = 0;
    do {
      puVar6 = (undefined8 *)malloc(0x10);
      *puVar6 = 0;
      puVar6[1] = 0;
      ppvVar5[uVar11] = puVar6;
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
  }
  vFramePPs->nSize = uVar13;
  iVar1 = pCex->nRegs;
  iVar14 = uVar13 * pCex->nPis + iVar1;
  if (iVar14 < 0) {
LAB_005785f1:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  (pAig->pConst1->field_5).iData = iVar14 * 2 + 1;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 1000;
  vRoots->nSize = 0;
  piVar7 = (int *)malloc(4000);
  vRoots->pArray = piVar7;
  if (-1 < pCex->iFrame) {
    uVar8 = 0xffffffff;
    if (-1 < (int)uVar12) {
      uVar8 = uVar12;
    }
    uVar11 = 0;
    do {
      if (((long)vFrameCis->nSize <= (long)uVar11) || (uVar11 == uVar8 + 1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
      }
      p = (Vec_Int_t *)ppvVar5[uVar11];
      if (p->nSize != 0) {
        __assert_fail("Vec_IntSize(vFramePPsOne) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                      ,0x14b,
                      "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                     );
      }
      pvVar2 = vFrameCis->pArray[uVar11];
      iVar14 = (int)uVar11;
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar4 = 0;
        uVar12 = 0;
        do {
          pVVar10 = pAig->vObjs;
          if (pVVar10 == (Vec_Ptr_t *)0x0) {
            piVar7 = (int *)0x0;
          }
          else {
            uVar13 = *(uint *)(*(long *)((long)pvVar2 + 8) + lVar4 * 4);
            if (((int)uVar13 < 0) || (pVVar10->nSize <= (int)uVar13)) goto LAB_005785b3;
            piVar7 = (int *)pVVar10->pArray[uVar13];
          }
          if (((uint)*(undefined8 *)(piVar7 + 6) & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                          ,0x14e,
                          "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                         );
          }
          if (*piVar7 < pAig->nTruePis) {
            iVar9 = ~uVar12 + iVar1 + pCex->nPis * (iVar14 + 1);
            if (iVar9 < 0) goto LAB_005785f1;
            uVar12 = uVar12 + 1;
            uVar13 = pCex->nPis * iVar14 + pCex->nRegs + *piVar7;
            iVar9 = (uint)(((uint)(&pCex[1].iPo)[(int)uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) +
                    iVar9 * 2;
          }
          else if (uVar11 == 0) {
            iVar9 = *piVar7 - pAig->nTruePis;
            if (*piVar7 < pAig->nTruePis) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                            ,0x58,"int Saig_ObjRegId(Aig_Man_t *, Aig_Obj_t *)");
            }
            if (iVar9 < 0) goto LAB_005785f1;
            iVar9 = iVar9 * 2;
          }
          else {
            if (*piVar7 < pAig->nTruePis) {
              __assert_fail("Saig_ObjIsLo(p, pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                            ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
            }
            uVar13 = (*piVar7 - pAig->nTruePis) + pAig->nTruePos;
            if (((int)uVar13 < 0) || (pAig->vCos->nSize <= (int)uVar13)) goto LAB_005785b3;
            iVar9 = *(int *)((long)pAig->vCos->pArray[uVar13] + 0x28);
          }
          Vec_IntPush(p,iVar9);
          lVar4 = lVar4 + 1;
        } while (lVar4 < *(int *)((long)pvVar2 + 4));
      }
      Saig_ManCexMinDerivePhasePriority(pAig,pCex,vFrameCis,vFramePPs,iVar14,vRoots);
      bVar3 = (long)uVar11 < (long)pCex->iFrame;
      uVar11 = uVar11 + 1;
    } while (bVar3);
  }
  if (vRoots->pArray != (int *)0x0) {
    free(vRoots->pArray);
    vRoots->pArray = (int *)0x0;
  }
  free(vRoots);
  iVar1 = pCex->iPo;
  if ((-1 < (long)iVar1) && (iVar1 < pAig->vCos->nSize)) {
    uVar12 = *(uint *)((long)pAig->vCos->pArray[iVar1] + 0x28);
    if ((int)uVar12 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x130,"int Abc_LitIsCompl(int)");
    }
    if ((uVar12 & 1) == 0) {
      __assert_fail("Abc_LitIsCompl(pObj->iData)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexMin1.c"
                    ,0x15c,
                    "Vec_Vec_t *Saig_ManCexMinCollectPhasePriority(Aig_Man_t *, Abc_Cex_t *, Vec_Vec_t *)"
                   );
    }
    return vFramePPs;
  }
LAB_005785b3:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Vec_t * Saig_ManCexMinCollectPhasePriority( Aig_Man_t * pAig, Abc_Cex_t * pCex, Vec_Vec_t * vFrameCis )
{
    Vec_Vec_t * vFramePPs;
    Vec_Int_t * vRoots, * vFramePPsOne, * vFrameCisOne;
    Aig_Obj_t * pObj;
    int i, f, nPrioOffset;

    // initialize phase and priority
    Aig_ManForEachObj( pAig, pObj, i )
        pObj->iData = -1;

    // set the constant node to higher priority than the flops
    vFramePPs = Vec_VecStart( pCex->iFrame+1 );
    nPrioOffset = pCex->nRegs;
    Aig_ManConst1(pAig)->iData = Abc_Var2Lit( nPrioOffset + (pCex->iFrame + 1) * pCex->nPis, 1 );
    vRoots = Vec_IntAlloc( 1000 );
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        int nPiCount = 0;
        // fill in PP for the CIs
        vFrameCisOne = Vec_VecEntryInt( vFrameCis, f );
        vFramePPsOne = Vec_VecEntryInt( vFramePPs, f );
        assert( Vec_IntSize(vFramePPsOne) == 0 );
        Aig_ManForEachObjVec( vFrameCisOne, pAig, pObj, i )
        {
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(pAig, pObj) )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( nPrioOffset + (f+1) * pCex->nPis - 1 - nPiCount++, Abc_InfoHasBit(pCex->pData, pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj)) ) );
            else if ( f == 0 )
                Vec_IntPush( vFramePPsOne, Abc_Var2Lit( Saig_ObjRegId(pAig, pObj), 0 ) );
            else
                Vec_IntPush( vFramePPsOne, Saig_ObjLoToLi(pAig, pObj)->iData );
        }
        // compute the PP info
        Saig_ManCexMinDerivePhasePriority( pAig, pCex, vFrameCis, vFramePPs, f, vRoots );
    }
    Vec_IntFree( vRoots );
    // check the output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    assert( Abc_LitIsCompl(pObj->iData) );
    return vFramePPs;
}